

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

void __thiscall ADPlanner::costs_changed(ADPlanner *this,StateChangeQuery *stateChange)

{
  ADSearchStateSpace_t *pAVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined1 auVar2 [16];
  
  pAVar1 = this->pSearchStateSpace_;
  pAVar1->bReevaluatefvals = true;
  if ((pAVar1->bReinitializeSearchStateSpace == false) && (pAVar1->searchiteration != 0)) {
    auVar2 = (**(code **)(*(long *)stateChange + 0x10 + (ulong)this->bforwardsearch * 8))
                       (stateChange);
    UNRECOVERED_JUMPTABLE = (this->super_SBPLPlanner)._vptr_SBPLPlanner[0x37];
    (*UNRECOVERED_JUMPTABLE)(this,auVar2._0_8_,auVar2._8_8_,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void ADPlanner::costs_changed(StateChangeQuery const & stateChange)
{
    //recompute f values
    pSearchStateSpace_->bReevaluatefvals = true;

    //no processing if no search efforts anyway
    if (pSearchStateSpace_->bReinitializeSearchStateSpace == true || pSearchStateSpace_->searchiteration == 0) return;

    if (bforwardsearch)
        Update_SearchSuccs_of_ChangedEdges(stateChange.getSuccessors());
    else
        Update_SearchSuccs_of_ChangedEdges(stateChange.getPredecessors());
}